

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O3

Handle * __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Insert
          (ShardedLRUCache *this,Slice *key,void *value,size_t charge,
          _func_void_Slice_ptr_void_ptr *deleter)

{
  char *pcVar1;
  uint uVar2;
  size_t __n;
  LRUHandle *pLVar3;
  LRUHandle *pLVar4;
  LRUHandle *pLVar5;
  uint32_t uVar6;
  uint uVar7;
  LRUHandle *pLVar8;
  LRUHandle **ppLVar9;
  size_t *psVar10;
  char *__dest;
  LRUHandle *old;
  LRUHandle *pLVar11;
  Slice *key_00;
  char *this_00;
  ulong uVar12;
  HandleTable *this_01;
  LRUCache *this_02;
  
  uVar6 = Hash(key->data_,key->size_,0);
  uVar12 = (ulong)((uVar6 >> 0x1c) * 0x90);
  this_02 = (LRUCache *)(this->shard_[0].lru_.key_data + (uVar12 - 0x78));
  this_00 = this->shard_[0].lru_.key_data + (uVar12 - 0x70);
  port::Mutex::Lock((Mutex *)this_00);
  __n = key->size_;
  pLVar8 = (LRUHandle *)malloc(__n + 0x47);
  pLVar8->value = value;
  pLVar8->deleter = deleter;
  pLVar8->charge = charge;
  pLVar8->key_length = __n;
  pLVar8->hash = uVar6;
  pLVar8->refs = 2;
  __dest = pLVar8->key_data;
  memcpy(__dest,key->data_,__n);
  pLVar11 = (LRUHandle *)(this->shard_[0].lru_.key_data + (uVar12 - 0x40));
  pLVar8->next = pLVar11;
  pLVar3 = *(LRUHandle **)(this->shard_[0].lru_.key_data + (uVar12 - 0x20));
  pLVar8->prev = pLVar3;
  pLVar3->next = pLVar8;
  *(LRUHandle **)(this->shard_[0].lru_.key_data + (uVar12 - 0x20)) = pLVar8;
  pcVar1 = this->shard_[0].lru_.key_data + (uVar12 - 0x48);
  *(size_t *)pcVar1 = *(long *)pcVar1 + charge;
  if (pLVar11 == pLVar8) {
    __dest = *value;
  }
  this_01 = (HandleTable *)((long)(&this->shard_[0].lru_ + 1) + 0x40 + (uVar12 - 0x40));
  uVar2 = *(uint *)((long)(&this->shard_[0].lru_ + 1) + 0x40 + (uVar12 - 0x40));
  ppLVar9 = HandleTable::FindPointer
                      ((HandleTable *)(ulong)uVar2,
                       *(Slice **)((long)(&this->shard_[0].lru_ + 1) + 0x40 + (uVar12 - 0x38)),
                       (uint32_t)__dest);
  pLVar3 = *ppLVar9;
  if (pLVar3 == (LRUHandle *)0x0) {
    pLVar8->next_hash = (LRUHandle *)0x0;
    *ppLVar9 = pLVar8;
    uVar7 = *(int *)((long)(&this->shard_[0].lru_ + 1) + 0x40 + (uVar12 - 0x3c)) + 1;
    *(uint *)((long)(&this->shard_[0].lru_ + 1) + 0x40 + (uVar12 - 0x3c)) = uVar7;
    if (uVar2 < uVar7) {
      HandleTable::Resize(this_01);
    }
  }
  else {
    pLVar8->next_hash = pLVar3->next_hash;
    *ppLVar9 = pLVar8;
    pLVar4 = pLVar3->next;
    pLVar5 = pLVar3->prev;
    pLVar4->prev = pLVar5;
    pLVar5->next = pLVar4;
    LRUCache::Unref(this_02,pLVar3);
  }
  while ((this_02->capacity_ < *(ulong *)(this->shard_[0].lru_.key_data + (uVar12 - 0x48)) &&
         (pLVar3 = *(LRUHandle **)(this->shard_[0].lru_.key_data + (uVar12 - 0x28)),
         pLVar3 != pLVar11))) {
    pLVar4 = pLVar3->next;
    pLVar5 = pLVar3->prev;
    pLVar4->prev = pLVar5;
    pLVar5->next = pLVar4;
    if (pLVar4 == pLVar3) {
      key_00 = *pLVar3->value;
      psVar10 = (size_t *)((long)pLVar3->value + 8);
    }
    else {
      key_00 = (Slice *)pLVar3->key_data;
      psVar10 = &pLVar3->key_length;
    }
    HandleTable::Remove(this_01,key_00,(uint32_t)*psVar10);
    LRUCache::Unref(this_02,pLVar3);
  }
  port::Mutex::Unlock((Mutex *)this_00);
  return (Handle *)pLVar8;
}

Assistant:

virtual Handle *Insert(const Slice &key, void *value, size_t charge,
                                   void (*deleter)(const Slice &key, void *value)) {
                const uint32_t hash = HashSlice(key);
                return shard_[Shard(hash)].Insert(key, hash, value, charge, deleter);
            }